

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O3

MPP_RET put_frame(Kmpp *ctx,MppFrame frame)

{
  int iVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  MppBuffer buffer;
  MppMeta meta;
  MPP_RET MVar4;
  MppEncROICfg *roi_data;
  MppPacket packet;
  MppEncROICfgLegacy roi_data0;
  RK_U32 local_138;
  RK_U32 local_134;
  RK_U32 local_130;
  RK_U32 local_12c;
  RK_U32 local_128;
  RK_U32 local_124;
  RK_U32 local_120;
  MppFrameFormat local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  uint *local_c0;
  MppPacket local_b8;
  undefined4 local_b0;
  uint local_ac;
  undefined1 local_a8 [128];
  
  if (ctx == (Kmpp *)0x0) {
    MVar4 = MPP_ERR_VALUE;
  }
  else if (ctx->mInitDone == 0) {
    MVar4 = MPP_ERR_INIT;
  }
  else {
    buffer = mpp_frame_get_buffer(frame);
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    local_138 = mpp_frame_get_width(frame);
    local_134 = mpp_frame_get_height(frame);
    local_130 = mpp_frame_get_hor_stride(frame);
    local_12c = mpp_frame_get_ver_stride(frame);
    local_128 = mpp_frame_get_hor_stride_pixel(frame);
    local_124 = mpp_frame_get_offset_x(frame);
    local_120 = mpp_frame_get_offset_y(frame);
    local_11c = mpp_frame_get_fmt(frame);
    iVar1 = mpp_buffer_get_fd_with_caller(buffer,"put_frame");
    local_118 = CONCAT44(local_118._4_4_,iVar1);
    RVar2 = mpp_frame_has_meta(frame);
    if (RVar2 != 0) {
      meta = mpp_frame_get_meta(frame);
      local_b8 = (MppPacket)0x0;
      mpp_meta_get_packet(meta,KEY_OUTPUT_PACKET,&local_b8);
      ctx->mPacket = local_b8;
      local_c0 = (uint *)0x0;
      mpp_meta_get_ptr(meta,KEY_ROI_DATA,&local_c0);
      if (local_c0 != (uint *)0x0) {
        local_b0 = 1;
        local_ac = *local_c0;
        memcpy(local_a8,*(void **)(local_c0 + 2),(ulong)local_ac << 4);
        (*ctx->mApi->control)(ctx,MPP_ENC_SET_ROI_CFG,&local_b0);
      }
    }
    MVar3 = mpp_vcodec_ioctl(ctx->mClientFd,0x400,0,0x78,&local_138);
    MVar4 = MPP_OK;
    if (MVar3 != MPP_OK) {
      _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_IN_FRM_RDY failed\n",(char *)0x0,
                 (ulong)(uint)ctx->mChanId);
      MVar4 = MVar3;
    }
  }
  return MVar4;
}

Assistant:

static MPP_RET put_frame(Kmpp *ctx, MppFrame frame)
{
    KmppFrameInfos frame_info;
    MppBuffer buf = NULL;
    MPP_RET ret = MPP_OK;

    if (!ctx)
        return MPP_ERR_VALUE;

    if (!ctx->mInitDone)
        return MPP_ERR_INIT;

    buf = mpp_frame_get_buffer(frame);
    memset(&frame_info, 0, sizeof(frame_info));
    frame_info.width = mpp_frame_get_width(frame);
    frame_info.height = mpp_frame_get_height(frame);
    frame_info.hor_stride = mpp_frame_get_hor_stride(frame);
    frame_info.ver_stride = mpp_frame_get_ver_stride(frame);
    frame_info.hor_stride_pixel = mpp_frame_get_hor_stride_pixel(frame);
    frame_info.offset_x = mpp_frame_get_offset_x(frame);
    frame_info.offset_y = mpp_frame_get_offset_y(frame);
    frame_info.fmt = mpp_frame_get_fmt(frame);
    frame_info.fd = mpp_buffer_get_fd(buf);
    // frame_info.pts = mpp_frame_get_pts(frame);
    // frame_info.jpeg_chan_id = mpp_frame_get_jpege_chan_id(frame);
    // frame_info.eos = mpp_frame_get_eos(frame);
    // frame_info.pskip = mpp_frame_get_pskip_request(frame);
    // frame_info.pskip_num = mpp_frame_get_pskip_num(frame);
    if (mpp_frame_has_meta(frame)) {
        MppMeta meta = mpp_frame_get_meta(frame);
        MppPacket packet = NULL;

        mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);
        ctx->mPacket = packet;

        /* set roi */
        {
            MppEncROICfg *roi_data = NULL;
            MppEncROICfgLegacy roi_data0;

            mpp_meta_get_ptr(meta, KEY_ROI_DATA, (void**)&roi_data);
            if (roi_data) {
                roi_data0.change = 1;
                roi_data0.number = roi_data->number;
                memcpy(roi_data0.regions, roi_data->regions, roi_data->number * sizeof(MppEncROIRegion));
                ctx->mApi->control(ctx, MPP_ENC_SET_ROI_CFG, &roi_data0);
            }
        }
    }

    ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_IN_FRM_RDY, 0, sizeof(frame_info), &frame_info);
    if (ret)
        mpp_err("chan %d VCODEC_CHAN_IN_FRM_RDY failed\n", ctx->mChanId);

    return ret;
}